

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O1

bool __thiscall booster::fork_shared_mutex::try_unique_lock(fork_shared_mutex *this)

{
  int iVar1;
  int *piVar2;
  system_error *this_00;
  error_category *peVar3;
  bool bVar4;
  flock lock;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar1 = pthread_rwlock_trywrlock((pthread_rwlock_t *)(this->d).ptr_);
  if (iVar1 == 0) {
    uStack_40 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 1;
    do {
      iVar1 = fileno((FILE *)((this->d).ptr_)->lock_file);
      iVar1 = fcntl(iVar1,6,&local_48);
      bVar4 = iVar1 == 0;
      if (bVar4) {
        return bVar4;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      pthread_rwlock_unlock((pthread_rwlock_t *)(this->d).ptr_);
      if ((iVar1 != 0xb) && (iVar1 != 0xd)) {
        this_00 = (system_error *)__cxa_allocate_exception(0x40);
        peVar3 = (error_category *)std::_V2::system_category();
        system::system_error::system_error(this_00,iVar1,peVar3,"fork_shared_mutex: failed to lock")
        ;
        __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool fork_shared_mutex::try_unique_lock()
	{
		if(pthread_rwlock_trywrlock(&d->lock)!=0)
			return false;
		struct flock lock;
		memset(&lock,0,sizeof(lock));
		lock.l_type=F_WRLCK;
		lock.l_whence=SEEK_SET;
		int res = 0;
		while((res = ::fcntl(fileno(d->lock_file),F_SETLK,&lock))!=0 && errno==EINTR)
			;
		if(res == 0)
			return true;
		int err = errno;
		pthread_rwlock_unlock(&d->lock);
		if(err == EACCES || err==EAGAIN)
			return false;
		throw system::system_error(err,system::system_category(),"fork_shared_mutex: failed to lock");
	}